

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O0

bool __thiscall InterpreterThunkEmitter::NewThunkBlock(InterpreterThunkEmitter *this)

{
  code *pcVar1;
  bool bVar2;
  ScriptConfiguration *this_00;
  undefined4 *puVar3;
  ThreadContext *pTVar4;
  ThreadContextInfo *local_68;
  void *local_58;
  void *pdataTable;
  Type *block;
  BYTE *callTarget;
  ULONG_PTR UStack_38;
  DWORD count;
  intptr_t epilogEnd;
  PRUNTIME_FUNCTION pdataStart;
  EmitBufferAllocation<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
  *allocation;
  BYTE *buffer;
  InterpreterThunkEmitter *this_local;
  
  buffer = (BYTE *)this;
  this_00 = Js::ScriptContext::GetConfig(this->scriptContext);
  bVar2 = Js::ScriptConfiguration::IsNoDynamicThunks(this_00);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    if (this->thunkCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                         ,0x168,"(this->thunkCount == 0)","this->thunkCount == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pdataStart = (PRUNTIME_FUNCTION)
                 EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
                 ::AllocateBuffer(&this->emitBufferManager,0x1000,(BYTE **)&allocation,0,0,false,
                                  false);
    if ((TEmitBufferAllocation *)pdataStart == (TEmitBufferAllocation *)0x0) {
      Js::Throw::OutOfMemory();
    }
    bVar2 = EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
            ::ProtectBufferWithExecuteReadWriteForInterpreter
                      (&this->emitBufferManager,(TEmitBufferAllocation *)pdataStart);
    if (!bVar2) {
      Js::Throw::OutOfMemory();
    }
    epilogEnd = 0;
    UStack_38 = 0;
    callTarget._4_4_ = this->thunkCount;
    pTVar4 = Js::ScriptContext::GetThreadContext(this->scriptContext);
    local_68 = (ThreadContextInfo *)0x0;
    if (pTVar4 != (ThreadContext *)0x0) {
      local_68 = &pTVar4->super_ThreadContextInfo;
    }
    FillBuffer(local_68,(bool)(this->isAsmInterpreterThunk & 1),(intptr_t)allocation,0x1000,
               (BYTE *)allocation,(PRUNTIME_FUNCTION *)&epilogEnd,
               (intptr_t *)&stack0xffffffffffffffc8,(DWORD *)((long)&callTarget + 4));
    bVar2 = EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
            ::CommitBufferForInterpreter
                      (&this->emitBufferManager,(TEmitBufferAllocation *)pdataStart,
                       (BYTE *)allocation,0x1000);
    if (!bVar2) {
      Js::Throw::OutOfMemory();
    }
    block = (Type *)allocation;
    pTVar4 = ThreadContext::GetContextForCurrentThread();
    ThreadContextInfo::SetValidCallTargetForCFG(&pTVar4->super_ThreadContextInfo,block,true);
    pdataTable = SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount>::
                 PrependNode<unsigned_char*,unsigned_int>
                           ((SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount> *)
                            &this->thunkBlocks,this->allocator,(uchar *)allocation,callTarget._4_4_)
    ;
    PDataManager::RegisterPdata
              ((RUNTIME_FUNCTION *)epilogEnd,(ULONG_PTR)allocation,UStack_38,&local_58,1,1);
    ThunkBlock::SetPdata((ThunkBlock *)pdataTable,local_58);
    this->thunkBuffer = (BYTE *)allocation;
    this->thunkCount = callTarget._4_4_;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool InterpreterThunkEmitter::NewThunkBlock()
{
    if (this->scriptContext->GetConfig()->IsNoDynamicThunks())
    {
        return false;
    }

#ifdef ENABLE_OOP_NATIVE_CODEGEN
    if (CONFIG_FLAG(ForceStaticInterpreterThunk))
    {
        return false;
    }

    if (JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        return NewOOPJITThunkBlock();
    }
#endif

    Assert(this->thunkCount == 0);
    BYTE* buffer;

    EmitBufferAllocation<VirtualAllocWrapper, PreReservedVirtualAllocWrapper> * allocation = emitBufferManager.AllocateBuffer(BlockSize, &buffer);
    if (allocation == nullptr)
    {
        Js::Throw::OutOfMemory();
    }
    if (!emitBufferManager.ProtectBufferWithExecuteReadWriteForInterpreter(allocation))
    {
        Js::Throw::OutOfMemory();
    }

#if PDATA_ENABLED
    PRUNTIME_FUNCTION pdataStart = nullptr;
    intptr_t epilogEnd = 0;
#endif

    DWORD count = this->thunkCount;
    FillBuffer(
        this->scriptContext->GetThreadContext(),
        this->isAsmInterpreterThunk,
        (intptr_t)buffer,
        BlockSize,
        buffer,
#if PDATA_ENABLED
        &pdataStart,
        &epilogEnd,
#endif
        &count
    );

    if (!emitBufferManager.CommitBufferForInterpreter(allocation, buffer, BlockSize))
    {
        Js::Throw::OutOfMemory();
    }

    // Call to set VALID flag for CFG check
    BYTE* callTarget = buffer;
#ifdef _M_ARM
    // We want to allow the actual callable value, so thumb-tag the address
    callTarget = (BYTE*)((uintptr_t)buffer | 0x1);
#endif
    ThreadContext::GetContextForCurrentThread()->SetValidCallTargetForCFG(callTarget);

    // Update object state only at the end when everything has succeeded - and no exceptions can be thrown.
    auto block = this->thunkBlocks.PrependNode(allocator, buffer, count);
#if PDATA_ENABLED
    void* pdataTable;
    PDataManager::RegisterPdata((PRUNTIME_FUNCTION)pdataStart, (ULONG_PTR)buffer, (ULONG_PTR)epilogEnd, &pdataTable);
    block->SetPdata(pdataTable);
#else
    Unused(block);
#endif
    this->thunkBuffer = buffer;
    this->thunkCount = count;
    return true;
}